

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O0

void __thiscall argo::unparser::print_indent(unparser *this,int indent_level)

{
  writer *w;
  char *pcVar1;
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  int i;
  int indent_level_local;
  unparser *this_local;
  
  local_14 = indent_level;
  _i = this;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    w = this->m_writer;
    pcVar1 = this->m_indent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    argo::operator<<(w,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void unparser::print_indent(int indent_level)
{
    for (int i = 0; i < indent_level; i++)
    {
        m_writer << m_indent;
    }
}